

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

ParameterizedTestCaseInfo<RenderTest> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<RenderTest>,testing::internal::ParameterizedTestCaseInfoBase>
          (ParameterizedTestCaseInfoBase *base)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ParameterizedTestCaseInfo<RenderTest> *pPVar3;
  undefined8 uVar4;
  GTestLog local_c;
  
  if (base != (ParameterizedTestCaseInfoBase *)0x0) {
    __s1 = *(char **)(base->_vptr_ParameterizedTestCaseInfoBase[-1] + 8);
    if (__s1 == "N7testing8internal25ParameterizedTestCaseInfoI10RenderTestEE") {
      bVar1 = true;
    }
    else if (*__s1 == '*') {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(__s1,"N7testing8internal25ParameterizedTestCaseInfoI10RenderTestEE");
      bVar1 = iVar2 == 0;
    }
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/gtest/gtest.h"
                         ,0x8d2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
      GTestLog::~GTestLog(&local_c);
    }
    pPVar3 = (ParameterizedTestCaseInfo<RenderTest> *)
             __dynamic_cast(base,&ParameterizedTestCaseInfoBase::typeinfo,
                            &ParameterizedTestCaseInfo<RenderTest>::typeinfo,0);
    return pPVar3;
  }
  uVar4 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar4);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}